

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O0

char * get_backup_path(char *romfile)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *backuppath;
  int backup_path_buf_size;
  char *rom_path;
  char buf [4096];
  char *in_stack_ffffffffffffefd8;
  char *in_stack_ffffffffffffefe0;
  undefined1 local_1008 [4104];
  
  pcVar2 = portable_realpath(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
  sVar3 = strlen(pcVar2);
  iVar1 = (int)sVar3 + 8;
  if (0xfff < iVar1) {
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/gba_system.c",0x27)
    ;
    fprintf(_stderr,"Backup path too long! How deeply are you nesting your directories?\n\x1b[0;m");
    exit(1);
  }
  pcVar2 = (char *)malloc((long)iVar1);
  snprintf(pcVar2,(long)iVar1,"%s.backup",local_1008);
  return pcVar2;
}

Assistant:

const char* get_backup_path(const char* romfile) {
    char buf[PATH_MAX];
    char* rom_path = portable_realpath(romfile, buf);
    int backup_path_buf_size = strlen(rom_path) + 8; // .backup + null terminator

    if (backup_path_buf_size >= PATH_MAX) {
        logfatal("Backup path too long! How deeply are you nesting your directories?")
    }

    char* backuppath = malloc(backup_path_buf_size);
    snprintf(backuppath, backup_path_buf_size, "%s.backup", buf);
    return backuppath;
}